

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v8::detail::default_arg_formatter<char>::operator()
          (default_arg_formatter<char> *this,void *value)

{
  appender aVar1;
  locale_ref local_40;
  basic_format_specs<char> local_38;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_28;
  void *local_20;
  void *value_local;
  default_arg_formatter<char> *this_local;
  
  local_28.container =
       (this->out).super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_20 = value;
  value_local = this;
  basic_format_specs<char>::basic_format_specs(&local_38);
  locale_ref::locale_ref(&local_40);
  aVar1 = write<char,_fmt::v8::appender,_void,_0>
                    ((appender)local_28.container,value,&local_38,local_40);
  return (iterator)
         aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }